

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

void __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
DoMarkArgsAsVars<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                 *con,int param_3)

{
  undefined4 in_EDX;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_> *in_RSI;
  function<void_(int)> *in_stack_ffffffffffffffb8;
  function<void_(int)> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe8;
  
  std::function<void_(int)>::function(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  VisitArguments<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>>
            (in_RSI,(function<void_(int)> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  std::function<void_(int)>::~function((function<void_(int)> *)0x25f799);
  return;
}

Assistant:

void DoMarkArgsAsVars(const Con& con, int ) {
    VisitArguments(con, MarkVar_);
  }